

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

void __thiscall script_tests::script_json_test::test_method(script_json_test *this)

{
  string_view jsondata;
  string_view hex_str;
  ulong uVar1;
  size_t sVar2;
  UniValue *pUVar3;
  ScriptTest *this_00;
  long in_FS_OFFSET;
  int scriptError;
  uint scriptflags;
  uint i;
  uint pos;
  CAmount nValue;
  UniValue *test;
  uint idx;
  int in_stack_00000170;
  CAmount in_stack_00000178;
  CScriptWitness witness;
  CScript scriptPubKey;
  string scriptPubKeyString;
  CScript scriptSig;
  string scriptSigString;
  string strTest;
  UniValue tests;
  UniValue *in_stack_fffffffffffffca8;
  undefined4 uVar4;
  UniValue *in_stack_fffffffffffffcb0;
  assertion_result *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  ScriptError_t in_stack_fffffffffffffcc4;
  string *in_stack_fffffffffffffcc8;
  UniValue *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  uint in_stack_fffffffffffffcdc;
  string *in_stack_fffffffffffffce0;
  UniValue *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 uVar5;
  int in_stack_fffffffffffffd0c;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  lazy_ostream *in_stack_fffffffffffffd18;
  string *in_stack_fffffffffffffd20;
  string *in_stack_fffffffffffffd70;
  undefined1 *in_stack_fffffffffffffd78;
  UniValue *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  UniValue *in_stack_fffffffffffffd90;
  uint local_220;
  int local_21c;
  UniValue *local_218;
  undefined4 in_stack_fffffffffffffe08;
  uint uVar6;
  const_string local_1e8 [2];
  lazy_ostream local_1b8 [2];
  assertion_result local_198 [4];
  undefined8 local_130;
  undefined1 *local_128;
  UniValue local_80;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_130 = 0x34a49;
  local_128 = json_tests::detail_script_tests_bytes;
  jsondata._M_len._4_4_ = in_stack_fffffffffffffd0c;
  jsondata._M_len._0_4_ = in_stack_fffffffffffffd08;
  jsondata._M_str._0_7_ = in_stack_fffffffffffffd10;
  jsondata._M_str._7_1_ = in_stack_fffffffffffffd17;
  read_json(jsondata);
  for (uVar6 = 0; uVar1 = (ulong)uVar6, sVar2 = UniValue::size(in_stack_fffffffffffffca8),
      uVar1 < sVar2; uVar6 = uVar6 + 1) {
    pUVar3 = UniValue::operator[]
                       ((UniValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                        (size_t)in_stack_fffffffffffffcb8);
    UniValue::write_abi_cxx11_(&local_80,(int)pUVar3,(void *)0x0,0);
    CScriptWitness::CScriptWitness((CScriptWitness *)in_stack_fffffffffffffca8);
    local_218 = (UniValue *)0x0;
    local_21c = 0;
    this_00 = (ScriptTest *)UniValue::size(in_stack_fffffffffffffca8);
    if (this_00 != (ScriptTest *)0x0) {
      in_stack_fffffffffffffd90 =
           UniValue::operator[]
                     ((UniValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                      (size_t)in_stack_fffffffffffffcb8);
      in_stack_fffffffffffffd8f = UniValue::isArray(in_stack_fffffffffffffca8);
      if ((bool)in_stack_fffffffffffffd8f) {
        local_220 = 0;
        while( true ) {
          in_stack_fffffffffffffd78 = (undefined1 *)(ulong)local_220;
          in_stack_fffffffffffffd80 =
               UniValue::operator[]
                         ((UniValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                          (size_t)in_stack_fffffffffffffcb8);
          in_stack_fffffffffffffd70 = (string *)UniValue::size(in_stack_fffffffffffffca8);
          if ((undefined1 *)((long)&in_stack_fffffffffffffd70[-1].field_2 + 0xfU) <=
              in_stack_fffffffffffffd78) break;
          UniValue::operator[]
                    ((UniValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                     (size_t)in_stack_fffffffffffffcb8);
          UniValue::operator[]
                    ((UniValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                     (size_t)in_stack_fffffffffffffcb8);
          UniValue::get_str_abi_cxx11_(in_stack_fffffffffffffcb0);
          std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffcc8);
          hex_str._M_len._7_1_ = in_stack_fffffffffffffd17;
          hex_str._M_len._0_7_ = in_stack_fffffffffffffd10;
          hex_str._M_str = (char *)in_stack_fffffffffffffd18;
          ParseHex<unsigned_char>(hex_str);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)in_stack_fffffffffffffca8,(value_type *)0xa4a668);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffcb8);
          local_220 = local_220 + 1;
        }
        UniValue::operator[]
                  ((UniValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                   (size_t)in_stack_fffffffffffffcb8);
        UniValue::operator[]
                  ((UniValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                   (size_t)in_stack_fffffffffffffcb8);
        local_218 = (UniValue *)
                    AmountFromValue((UniValue *)
                                    CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                                    in_stack_fffffffffffffd0c);
        local_21c = 1;
      }
    }
    sVar2 = UniValue::size(in_stack_fffffffffffffca8);
    if (sVar2 < local_21c + 4) {
      sVar2 = UniValue::size(in_stack_fffffffffffffca8);
      if (sVar2 != 1) {
        do {
          in_stack_fffffffffffffd20 = boost::unit_test::(anonymous_namespace)::unit_test_log;
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffffcb8,
                     (pointer)in_stack_fffffffffffffcb0,(unsigned_long)in_stack_fffffffffffffca8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffffca8);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_fffffffffffffce8,
                     (const_string *)in_stack_fffffffffffffce0,
                     CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                     (const_string *)in_stack_fffffffffffffcd0);
          boost::test_tools::assertion_result::assertion_result
                    (in_stack_fffffffffffffcb8,SUB81((ulong)in_stack_fffffffffffffcb0 >> 0x38,0));
          in_stack_fffffffffffffd18 = boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_fffffffffffffcb0,
                     (char (*) [11])in_stack_fffffffffffffca8);
          boost::unit_test::operator<<
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>
                      *)in_stack_fffffffffffffcb0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffca8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffffcb8,
                     (pointer)in_stack_fffffffffffffcb0,(unsigned_long)in_stack_fffffffffffffca8);
          in_stack_fffffffffffffca8 = (UniValue *)0x0;
          boost::test_tools::tt_detail::report_assertion(local_198,local_1b8,local_1e8,0x3a9,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_fffffffffffffca8);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>
                              *)in_stack_fffffffffffffca8);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffffca8);
          in_stack_fffffffffffffd17 = boost::test_tools::tt_detail::dummy_cond();
        } while ((bool)in_stack_fffffffffffffd17);
      }
    }
    else {
      pUVar3 = UniValue::operator[]
                         ((UniValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                          (size_t)in_stack_fffffffffffffcb8);
      uVar5 = SUB84(pUVar3,0);
      in_stack_fffffffffffffd0c = (int)((ulong)pUVar3 >> 0x20);
      UniValue::get_str_abi_cxx11_(in_stack_fffffffffffffcb0);
      std::__cxx11::string::string
                (in_stack_fffffffffffffcf0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffce8);
      ParseScript((string *)CONCAT44(uVar6,in_stack_fffffffffffffe08));
      UniValue::operator[]
                ((UniValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 (size_t)in_stack_fffffffffffffcb8);
      in_stack_fffffffffffffcf0 = UniValue::get_str_abi_cxx11_(in_stack_fffffffffffffcb0);
      std::__cxx11::string::string
                (in_stack_fffffffffffffcf0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffce8);
      ParseScript((string *)CONCAT44(uVar6,in_stack_fffffffffffffe08));
      in_stack_fffffffffffffce8 =
           UniValue::operator[]
                     ((UniValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                      (size_t)in_stack_fffffffffffffcb8);
      in_stack_fffffffffffffce0 = UniValue::get_str_abi_cxx11_(in_stack_fffffffffffffcb0);
      std::__cxx11::string::string
                (in_stack_fffffffffffffcf0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffce8);
      in_stack_fffffffffffffcdc = ParseScriptFlags(in_stack_fffffffffffffd20);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffca8);
      uVar4 = (undefined4)((ulong)in_stack_fffffffffffffca8 >> 0x20);
      in_stack_fffffffffffffcd0 =
           UniValue::operator[]
                     ((UniValue *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                      (size_t)in_stack_fffffffffffffcb8);
      in_stack_fffffffffffffcc8 = UniValue::get_str_abi_cxx11_(in_stack_fffffffffffffcb0);
      in_stack_fffffffffffffcc4 =
           ParseScriptError((string *)CONCAT44(in_stack_fffffffffffffd0c,uVar5));
      in_stack_fffffffffffffca8 = (UniValue *)CONCAT44(uVar4,in_stack_fffffffffffffcc4);
      ScriptTest::DoTest(this_00,(CScript *)in_stack_fffffffffffffd90,
                         (CScript *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                         (CScriptWitness *)in_stack_fffffffffffffd80,
                         (uint32_t)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                         in_stack_fffffffffffffd70,in_stack_00000170,in_stack_00000178);
      CScript::~CScript((CScript *)in_stack_fffffffffffffca8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffca8);
      CScript::~CScript((CScript *)in_stack_fffffffffffffca8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffca8);
      in_stack_fffffffffffffcb0 = local_218;
    }
    CScriptWitness::~CScriptWitness((CScriptWitness *)in_stack_fffffffffffffca8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffca8);
  }
  UniValue::~UniValue(in_stack_fffffffffffffca8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(script_json_test)
{
    // Read tests from test/data/script_tests.json
    // Format is an array of arrays
    // Inner arrays are [ ["wit"..., nValue]?, "scriptSig", "scriptPubKey", "flags", "expected_scripterror" ]
    // ... where scriptSig and scriptPubKey are stringified
    // scripts.
    // If a witness is given, then the last value in the array should be the
    // amount (nValue) to use in the crediting tx
    UniValue tests = read_json(json_tests::script_tests);

    for (unsigned int idx = 0; idx < tests.size(); idx++) {
        const UniValue& test = tests[idx];
        std::string strTest = test.write();
        CScriptWitness witness;
        CAmount nValue = 0;
        unsigned int pos = 0;
        if (test.size() > 0 && test[pos].isArray()) {
            unsigned int i=0;
            for (i = 0; i < test[pos].size()-1; i++) {
                witness.stack.push_back(ParseHex(test[pos][i].get_str()));
            }
            nValue = AmountFromValue(test[pos][i]);
            pos++;
        }
        if (test.size() < 4 + pos) // Allow size > 3; extra stuff ignored (useful for comments)
        {
            if (test.size() != 1) {
                BOOST_ERROR("Bad test: " << strTest);
            }
            continue;
        }
        std::string scriptSigString = test[pos++].get_str();
        CScript scriptSig = ParseScript(scriptSigString);
        std::string scriptPubKeyString = test[pos++].get_str();
        CScript scriptPubKey = ParseScript(scriptPubKeyString);
        unsigned int scriptflags = ParseScriptFlags(test[pos++].get_str());
        int scriptError = ParseScriptError(test[pos++].get_str());

        DoTest(scriptPubKey, scriptSig, witness, scriptflags, strTest, scriptError, nValue);
    }
}